

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

char * stagger(permonst *ptr,char *def)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  int capitalize;
  char *def_local;
  permonst *ptr_local;
  
  cVar1 = *def;
  cVar2 = highc(*def);
  iVar3 = (cVar1 == cVar2) + 2;
  if (ptr->mlet == '\x05') {
    local_28 = levitate[iVar3];
  }
  else {
    if (((ptr->mflags1 & 1) == 0) || (1 < ptr->msize)) {
      if (((ptr->mflags1 & 1) == 0) || (ptr->msize < 2)) {
        if ((ptr->mflags1 & 0x80000) == 0) {
          if ((ptr->mflags1 & 4) == 0) {
            if (ptr->mmove == '\0') {
              local_50 = immobile[iVar3];
            }
            else {
              local_58 = def;
              if ((ptr->mflags1 & 0x6000) == 0x6000) {
                local_58 = crawl[iVar3];
              }
              local_50 = local_58;
            }
            local_48 = local_50;
          }
          else {
            local_48 = ooze[iVar3];
          }
          local_40 = local_48;
        }
        else {
          local_40 = slither[iVar3];
        }
        local_38 = local_40;
      }
      else {
        local_38 = flyl[iVar3];
      }
      local_30 = local_38;
    }
    else {
      local_30 = flys[iVar3];
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

const char *stagger(const struct permonst *ptr, const char *def)
{
	int capitalize = 2 + (*def == highc(*def));

	return (
		is_floater(ptr) ? levitate[capitalize] :
		(is_flyer(ptr) && ptr->msize <= MZ_SMALL) ? flys[capitalize] :
		(is_flyer(ptr) && ptr->msize > MZ_SMALL)  ? flyl[capitalize] :
		slithy(ptr)     ? slither[capitalize] :
		amorphous(ptr)  ? ooze[capitalize] :
		!ptr->mmove	? immobile[capitalize] :
		nolimbs(ptr)    ? crawl[capitalize] :
		def
	       );

}